

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O2

JsrtExternalObject *
JsrtExternalObject::Create
          (void *data,uint inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,RecyclableObject *prototype,
          ScriptContext *scriptContext,JsrtExternalType *type)

{
  bool bVar1;
  Recycler *pRVar2;
  undefined4 *puVar3;
  JsrtExternalObject *this;
  code *pcVar4;
  undefined1 local_68 [8];
  TrackAllocData data_1;
  
  data_1._32_8_ = data;
  if (prototype == (RecyclableObject *)0x0) {
    prototype = &Js::JavascriptLibraryBase::GetObjectPrototype
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase)->super_RecyclableObject;
  }
  if (type == (JsrtExternalType *)0x0) {
    type = Js::JavascriptLibrary::GetCachedJsrtExternalType
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                      (uintptr_t)traceCallback,(uintptr_t)finalizeCallback,(uintptr_t)prototype);
    if (type == (JsrtExternalType *)0x0) {
      local_68 = (undefined1  [8])&JsrtExternalType::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_414e33;
      data_1.filename._0_4_ = 0x5f;
      pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
      type = (JsrtExternalType *)new<Memory::Recycler>(0x48,pRVar2,0x37a1d4);
      JsrtExternalType::JsrtExternalType
                (type,scriptContext,traceCallback,finalizeCallback,prototype);
      Js::JavascriptLibrary::CacheJsrtExternalType
                ((scriptContext->super_ScriptContextBase).javascriptLibrary,(uintptr_t)traceCallback
                 ,(uintptr_t)finalizeCallback,(uintptr_t)prototype,type);
    }
  }
  if (((type->super_DynamicType).super_Type.flags & TypeFlagMask_JsrtExternal) == TypeFlagMask_None)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,100,"(type->IsJsrtExternal())","type->IsJsrtExternal()");
    if (!bVar1) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  data_1.typeinfo = (type_info *)(ulong)inlineSlotSize;
  if (traceCallback == (JsTraceCallback)0x0) {
    if (finalizeCallback == (JsFinalizeCallback)0x0) {
      local_68 = (undefined1  [8])&typeinfo;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_414e33;
      data_1.filename._0_4_ = 0x71;
      pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
      pcVar4 = Memory::Recycler::Alloc;
    }
    else {
      local_68 = (undefined1  [8])&typeinfo;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_414e33;
      data_1.filename._0_4_ = 0x6d;
      pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
      pcVar4 = Memory::Recycler::AllocFinalized;
    }
    this = (JsrtExternalObject *)
           new<Memory::Recycler>(0x30,pRVar2,(offset_in_Recycler_to_subr)pcVar4,0);
  }
  else {
    local_68 = (undefined1  [8])&typeinfo;
    data_1.plusSize = 0xffffffffffffffff;
    data_1.count = (size_t)anon_var_dwarf_414e33;
    data_1.filename._0_4_ = 0x69;
    pRVar2 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
    this = (JsrtExternalObject *)new<Memory::Recycler>(0x30,pRVar2,0x3a64ba,0);
  }
  JsrtExternalObject(this,type,(void *)data_1._32_8_,inlineSlotSize);
  return this;
}

Assistant:

JsrtExternalObject* JsrtExternalObject::Create(void *data, uint inlineSlotSize, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext, JsrtExternalType * type)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }
    if (type == nullptr)
    {
        type = scriptContext->GetLibrary()->GetCachedJsrtExternalType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype));

        if (type == nullptr)
        {
            type = RecyclerNew(scriptContext->GetRecycler(), JsrtExternalType, scriptContext, traceCallback, finalizeCallback, prototype);
            scriptContext->GetLibrary()->CacheJsrtExternalType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(prototype), type);
        }
    }

    Assert(type->IsJsrtExternal());

    JsrtExternalObject * externalObject;
    if (traceCallback != nullptr)
    {
        externalObject = RecyclerNewTrackedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else if (finalizeCallback != nullptr) 
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, JsrtExternalObject, static_cast<JsrtExternalType*>(type), data, inlineSlotSize);
    }

    return externalObject;
}